

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
RegisterBuildTestDyndepBuildDiscoverNewInputWithTransitiveValidation::
RegisterBuildTestDyndepBuildDiscoverNewInputWithTransitiveValidation
          (RegisterBuildTestDyndepBuildDiscoverNewInputWithTransitiveValidation *this)

{
  RegisterTest(BuildTestDyndepBuildDiscoverNewInputWithTransitiveValidation::Create,
               "BuildTest.DyndepBuildDiscoverNewInputWithTransitiveValidation");
  return;
}

Assistant:

TEST_F(BuildTest, DyndepBuildDiscoverNewInputWithTransitiveValidation) {
  // Verify that a dyndep file can be built and loaded to discover
  // a new input to an edge that has a validation edge.
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch\n"
"  command = touch $out\n"
"rule cp\n"
"  command = cp $in $out\n"
"build dd: cp dd-in\n"
"build in: touch |@ validation\n"
"build validation: touch in out\n"
"build out: touch || dd\n"
"  dyndep = dd\n"
  ));
  fs_.Create("dd-in",
"ninja_dyndep_version = 1\n"
"build out: dyndep | in\n"
);
  fs_.Tick();
  fs_.Create("out", "");

  string err;
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  EXPECT_EQ("", err);

  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);
  ASSERT_EQ(4u, command_runner_.commands_ran_.size());
  EXPECT_EQ("cp dd-in dd", command_runner_.commands_ran_[0]);
  EXPECT_EQ("touch in", command_runner_.commands_ran_[1]);
  EXPECT_EQ("touch out", command_runner_.commands_ran_[2]);
  EXPECT_EQ("touch validation", command_runner_.commands_ran_[3]);
}